

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O2

int duckdb_lz4::LZ4_decompress_safe_partial_usingDict
              (char *source,char *dest,int compressedSize,int targetOutputSize,int dstCapacity,
              char *dictStart,int dictSize)

{
  int iVar1;
  size_t dictSize_00;
  BYTE *lowPrefix;
  
  if (dictSize != 0) {
    dictSize_00 = (size_t)dictSize;
    if (dictStart + dictSize_00 == dest) {
      if (targetOutputSize < dstCapacity) {
        dstCapacity = targetOutputSize;
      }
      if (dictSize < 0xffff) {
        lowPrefix = (BYTE *)(dest + -dictSize_00);
      }
      else {
        lowPrefix = (BYTE *)(dest + -0x10000);
      }
      iVar1 = LZ4_decompress_generic
                        (source,dest,compressedSize,dstCapacity,partial_decode,
                         (uint)(dictSize >= 0xffff),lowPrefix,(BYTE *)0x0,0);
    }
    else {
      iVar1 = LZ4_decompress_safe_partial_forceExtDict
                        (source,dest,compressedSize,targetOutputSize,dstCapacity,dictStart,
                         dictSize_00);
    }
    return iVar1;
  }
  iVar1 = LZ4_decompress_safe_partial(source,dest,compressedSize,targetOutputSize,dstCapacity);
  return iVar1;
}

Assistant:

int LZ4_decompress_safe_partial_usingDict(const char* source, char* dest, int compressedSize, int targetOutputSize, int dstCapacity, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe_partial(source, dest, compressedSize, targetOutputSize, dstCapacity);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_partial_withPrefix64k(source, dest, compressedSize, targetOutputSize, dstCapacity);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_partial_withSmallPrefix(source, dest, compressedSize, targetOutputSize, dstCapacity, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_partial_forceExtDict(source, dest, compressedSize, targetOutputSize, dstCapacity, dictStart, (size_t)dictSize);
}